

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall
MPLSStreamInfo::composeStreamEntry
          (MPLSStreamInfo *this,BitStreamWriter *writer,size_t entryNum,int subPathID)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  uint uVar8;
  int iVar9;
  ostringstream ss;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  uint *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ostringstream local_1a8 [376];
  
  puVar1 = (writer->super_BitStream).m_buffer;
  puVar2 = (writer->super_BitStream).m_initBuffer;
  local_1b0 = (ulong)writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,0);
  puVar3 = (writer->super_BitStream).m_buffer;
  local_1c0 = (writer->super_BitStream).m_initBuffer;
  local_1b8 = (ulong)writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,(uint)this->type);
  local_1c8 = puVar2;
  switch(this->type) {
  case '\x01':
    uVar8 = (this->super_M2TSStreamInfo).streamPID;
    uVar4 = 0x10;
    goto LAB_001e5022;
  case '\x02':
    BitStreamWriter::putBits(writer,8,0);
    BitStreamWriter::putBits(writer,8,0);
    BitStreamWriter::putBits(writer,0x10,(this->super_M2TSStreamInfo).streamPID);
    uVar4 = 0x20;
    goto LAB_001e5073;
  case '\x03':
    break;
  case '\x04':
    subPathID = 0;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unsupported media type for AVCHD/Blu-ray muxing",0x2f);
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar7 = 3;
    *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
    if (local_1e8 == &local_1d8) {
      puVar7[6] = local_1d8;
      puVar7[7] = uStack_1d4;
      puVar7[8] = uStack_1d0;
      puVar7[9] = uStack_1cc;
    }
    else {
      *(uint **)(puVar7 + 2) = local_1e8;
      *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1d4,local_1d8);
    }
    *(undefined8 *)(puVar7 + 4) = local_1e0;
    local_1d8 = local_1d8 & 0xffffff00;
    __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  uVar4 = 8;
  BitStreamWriter::putBits(writer,8,subPathID);
  uVar8 = (this->super_M2TSStreamInfo).streamPID;
LAB_001e5022:
  BitStreamWriter::putBits(writer,0x10,uVar8);
  BitStreamWriter::putBits(writer,0x20,0);
LAB_001e5073:
  BitStreamWriter::putBits(writer,uVar4,0);
  local_1c0._0_4_ = (int)puVar3 - (int)local_1c0;
  uVar4 = (int)local_1b8 + (int)local_1c0 * 8;
  iVar9 = (int)puVar1 - (int)local_1c8;
  uVar8 = (int)local_1b8 + (int)local_1c0 * 8 + 7;
  if (-1 < (int)uVar4) {
    uVar8 = uVar4;
  }
  iVar5 = (int)local_1b0 + iVar9 * 8;
  iVar9 = (int)local_1b0 + iVar9 * 8 + 7;
  if (-1 < iVar5) {
    iVar9 = iVar5;
  }
  iVar5 = *(int *)&(writer->super_BitStream).m_buffer -
          *(int *)&(writer->super_BitStream).m_initBuffer;
  uVar4 = writer->m_bitWrited + iVar5 * 8;
  uVar6 = writer->m_bitWrited + iVar5 * 8 + 7;
  if (-1 < (int)uVar4) {
    uVar6 = uVar4;
  }
  *(char *)((long)local_1c8 + (long)(iVar9 >> 3)) = (char)(uVar6 >> 3) - (char)(uVar8 >> 3);
  return;
}

Assistant:

void MPLSStreamInfo::composeStreamEntry(BitStreamWriter& writer, size_t entryNum, const int subPathID) const
{
    uint8_t* lengthPos = writer.getBuffer() + writer.getBitsCount() / 8;
    writer.putBits(8, 0);  // length
    const int initPos = writer.getBitsCount() / 8;
    writer.putBits(8, type);
    if (type == 1)
    {
        writer.putBits(16, streamPID);
        writer.putBits(32, 0);
        writer.putBits(16, 0);
    }
    else if (type == 2)
    {
        writer.putBits(8, 0);  // ref_to_SubPath_id
        writer.putBits(8, 0);  // entryNum - ref_to_subClip_entry_id
        writer.putBits(16, streamPID);
        writer.putBits(32, 0);
    }
    else if (type == 3)
    {
        writer.putBits(8, subPathID);  // ref_to_SubPath_id. constant subPathID == 0
        writer.putBits(16, streamPID);
        writer.putBits(32, 0);
        writer.putBits(8, 0);
    }
    else if (type == 4)
    {
        writer.putBits(8, 0);
        writer.putBits(16, streamPID);
        writer.putBits(32, 0);
        writer.putBits(8, 0);
    }
    else
        THROW(ERR_COMMON, "Unsupported media type for AVCHD/Blu-ray muxing")
    *lengthPos = static_cast<uint8_t>(writer.getBitsCount() / 8 - initPos);
}